

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

uint8 get8(vorb *z)

{
  uint8 *puVar1;
  int iVar2;
  int c;
  vorb *z_local;
  
  if (z->stream == (uint8 *)0x0) {
    iVar2 = fgetc((FILE *)z->f);
    if (iVar2 == -1) {
      z->eof = 1;
      z_local._7_1_ = '\0';
    }
    else {
      z_local._7_1_ = (uint8)iVar2;
    }
  }
  else if (z->stream < z->stream_end) {
    puVar1 = z->stream;
    z->stream = puVar1 + 1;
    z_local._7_1_ = *puVar1;
  }
  else {
    z->eof = 1;
    z_local._7_1_ = '\0';
  }
  return z_local._7_1_;
}

Assistant:

static uint8 get8(vorb *z)
{
   if (USE_MEMORY(z)) {
      if (z->stream >= z->stream_end) { z->eof = TRUE; return 0; }
      return *z->stream++;
   }

   #ifndef STB_VORBIS_NO_STDIO
   {
   int c = fgetc(z->f);
   if (c == EOF) { z->eof = TRUE; return 0; }
   return c;
   }
   #endif
}